

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int ssl_append_key_cert(mbedtls_ssl_key_cert **head,mbedtls_x509_crt *cert,mbedtls_pk_context *key)

{
  mbedtls_ssl_key_cert *pmVar1;
  int iVar2;
  mbedtls_ssl_key_cert *pmVar3;
  mbedtls_ssl_key_cert *pmVar4;
  
  pmVar3 = (mbedtls_ssl_key_cert *)calloc(1,0x18);
  if (pmVar3 == (mbedtls_ssl_key_cert *)0x0) {
    iVar2 = -0x7f00;
  }
  else {
    pmVar3->cert = cert;
    pmVar3->key = key;
    pmVar1 = *head;
    if (*head != (mbedtls_ssl_key_cert *)0x0) {
      do {
        pmVar4 = pmVar1;
        pmVar1 = pmVar4->next;
      } while (pmVar1 != (mbedtls_ssl_key_cert *)0x0);
      head = &pmVar4->next;
    }
    *head = pmVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int ssl_append_key_cert( mbedtls_ssl_key_cert **head,
                                mbedtls_x509_crt *cert,
                                mbedtls_pk_context *key )
{
    mbedtls_ssl_key_cert *new;

    new = mbedtls_calloc( 1, sizeof( mbedtls_ssl_key_cert ) );
    if( new == NULL )
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

    new->cert = cert;
    new->key  = key;
    new->next = NULL;

    /* Update head is the list was null, else add to the end */
    if( *head == NULL )
    {
        *head = new;
    }
    else
    {
        mbedtls_ssl_key_cert *cur = *head;
        while( cur->next != NULL )
            cur = cur->next;
        cur->next = new;
    }

    return( 0 );
}